

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

errr cmdq_push_repeat(cmd_code c,wchar_t nrepeats)

{
  wchar_t wVar1;
  errr eVar2;
  command_conflict cmd;
  
  memset(&cmd,0,0xb0);
  wVar1 = cmd_idx(c);
  if (wVar1 == L'\xffffffff') {
    eVar2 = 1;
  }
  else {
    cmd.code = c;
    cmd.nrepeats = nrepeats;
    eVar2 = cmdq_push_copy(&cmd);
  }
  return eVar2;
}

Assistant:

errr cmdq_push_repeat(cmd_code c, int nrepeats)
{
	struct command cmd = {
		.context = CTX_INIT,
		.code = CMD_NULL,
		.nrepeats = 0,
		.is_background_command = false,
		.arg = { { 0 } }
	};

	if (cmd_idx(c) == -1)
		return 1;

	cmd.code = c;
	cmd.nrepeats = nrepeats;

	return cmdq_push_copy(&cmd);
}